

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanNewLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,uint ch)

{
  OLECHAR OVar1;
  
  if (ch == 0xd) {
    OVar1 = PeekNextChar(this);
    if (OVar1 == L'\n') {
      ReadNextChar(this);
    }
  }
  NotifyScannedNewLine(this);
  return;
}

Assistant:

void Scanner<EncodingPolicy>::ScanNewLine(uint ch)
{
    if (ch == '\r' && PeekNextChar() == '\n')
    {
        ReadNextChar();
    }

    NotifyScannedNewLine();
}